

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall FIX::HttpConnection::HttpConnection(HttpConnection *this,socket_handle s)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  socket_handle s_local;
  HttpConnection *this_local;
  
  this->m_socket = s;
  HttpParser::HttpParser(&this->m_parser);
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (this->m_fds).fds_bits[(uint)__arr] = 0;
  }
  iVar1 = this->m_socket / 0x40;
  (this->m_fds).fds_bits[iVar1] =
       1L << ((byte)((long)this->m_socket % 0x40) & 0x3f) | (this->m_fds).fds_bits[iVar1];
  return;
}

Assistant:

HttpConnection::HttpConnection(socket_handle s )
: m_socket( s )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}